

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char16_t * openjtalk_getHTSVoicePathU16(OpenJTalk *oj,HtsVoiceFilelist *list,uint i,char16_t *path)

{
  char16_t cVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  int iVar4;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (list != (HtsVoiceFilelist *)0x0) {
    iVar4 = i + 1;
    do {
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        memset(path,0,0x208);
        pcVar2 = (list->field_1).pathU16;
        pcVar3 = path;
        if (pcVar2 == (char16_t *)0x0 || path == (char16_t *)0x0) {
          return path;
        }
        do {
          cVar1 = *pcVar2;
          pcVar2 = pcVar2 + (cVar1 != 0);
          *pcVar3 = cVar1;
          pcVar3 = pcVar3 + 1;
        } while (*pcVar2 != 0);
        return path;
      }
      list = list->succ;
    } while (list != (HtsVoiceFilelist_tag *)0x0);
  }
  return (char16_t *)0x0;
}

Assistant:

OPENJTALK_DLL_API char16_t *OPENJTALK_CONVENTION openjtalk_getHTSVoicePathU16(OpenJTalk *oj, HtsVoiceFilelist *list, unsigned int i, char16_t *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	if (list == NULL)
	{
		return NULL;
	}

	//HtsVoiceFilelist* temp = list;
	unsigned int counter = 0;
	for (HtsVoiceFilelist *temp = list; temp != NULL; temp = temp->succ)
	{
		if (counter++ == i)
		{
			if (temp)
			{
				clear_path_stringU16(path, MAX_PATH);
				strcpyU16(path, temp->pathU16);
				return path;
			}
			else
			{
				return NULL;
			}
		}
	}
	return NULL;
}